

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O2

void __thiscall
miniros::TransportTCP::setKeepAlive
          (TransportTCP *this,bool use,uint32_t idle,uint32_t interval,uint32_t count)

{
  uint uVar1;
  int iVar2;
  Level level;
  undefined7 in_register_00000031;
  void *logger_handle;
  char *fmt;
  allocator<char> local_4d;
  int val;
  string local_48;
  
  if ((int)CONCAT71(in_register_00000031,use) == 0) {
    val = 0;
    iVar2 = setsockopt(this->sock_,1,9,&val,4);
    if (iVar2 == 0) {
      return;
    }
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"miniros.transport_tcp",&local_4d);
      console::initializeLogLocation
                (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc,&local_48,Debug);
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_ != Debug) {
      console::setLogLocationLevel
                (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc,Debug);
      console::checkLogLocationEnabled
                (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc);
    }
    if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_enabled_ != true) {
      return;
    }
    uVar1 = this->sock_;
    fmt = "setsockopt failed to set SO_KEEPALIVE on socket [%d] [%s]";
    iVar2 = 0xe2;
    logger_handle = setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_;
    level = setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_;
  }
  else {
    val = 1;
    iVar2 = setsockopt(this->sock_,1,9,&val,4);
    if (iVar2 != 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (setKeepAlive::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"miniros.transport_tcp",&local_4d);
        console::initializeLogLocation(&setKeepAlive::loc,&local_48,Debug);
        std::__cxx11::string::~string((string *)&local_48);
      }
      if (setKeepAlive::loc.level_ != Debug) {
        console::setLogLocationLevel(&setKeepAlive::loc,Debug);
        console::checkLogLocationEnabled(&setKeepAlive::loc);
      }
      if (setKeepAlive::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,setKeepAlive::loc.logger_,setKeepAlive::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0xbb,
                       "void miniros::TransportTCP::setKeepAlive(bool, uint32_t, uint32_t, uint32_t)"
                       ,"setsockopt failed to set SO_KEEPALIVE on socket [%d] [%s]",
                       (ulong)(uint)this->sock_,(this->cached_remote_host_)._M_dataplus._M_p);
      }
    }
    val = idle;
    iVar2 = setsockopt(this->sock_,6,4,&val,4);
    if (iVar2 != 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"miniros.transport_tcp",&local_4d);
        console::initializeLogLocation
                  (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc,&local_48,Debug);
        std::__cxx11::string::~string((string *)&local_48);
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_ != Debug) {
        console::setLogLocationLevel
                  (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc,Debug);
        console::checkLogLocationEnabled
                  (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc);
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,
                       setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_,
                       setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0xc3,
                       "void miniros::TransportTCP::setKeepAlive(bool, uint32_t, uint32_t, uint32_t)"
                       ,"setsockopt failed to set TCP_KEEPIDLE on socket [%d] [%s]",
                       (ulong)(uint)this->sock_,(this->cached_remote_host_)._M_dataplus._M_p);
      }
    }
    val = interval;
    iVar2 = setsockopt(this->sock_,6,5,&val,4);
    if (iVar2 != 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"miniros.transport_tcp",&local_4d);
        console::initializeLogLocation
                  (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc,&local_48,Debug);
        std::__cxx11::string::~string((string *)&local_48);
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_ != Debug) {
        console::setLogLocationLevel
                  (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc,Debug);
        console::checkLogLocationEnabled
                  (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc);
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,
                       setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_,
                       setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0xcd,
                       "void miniros::TransportTCP::setKeepAlive(bool, uint32_t, uint32_t, uint32_t)"
                       ,"setsockopt failed to set TCP_KEEPINTVL on socket [%d] [%s]",
                       (ulong)(uint)this->sock_,(this->cached_remote_host_)._M_dataplus._M_p);
      }
    }
    val = count;
    iVar2 = setsockopt(this->sock_,6,6,&val,4);
    if (iVar2 == 0) {
      return;
    }
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"miniros.transport_tcp",&local_4d);
      console::initializeLogLocation
                (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc,&local_48,Debug);
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_ != Debug) {
      console::setLogLocationLevel
                (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc,Debug);
      console::checkLogLocationEnabled
                (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc);
    }
    if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_enabled_ != true) {
      return;
    }
    uVar1 = this->sock_;
    fmt = "setsockopt failed to set TCP_KEEPCNT on socket [%d] [%s]";
    iVar2 = 0xd7;
    logger_handle = setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_;
    level = setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_;
  }
  console::print((FilterBase *)0x0,logger_handle,level,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                 ,iVar2,
                 "void miniros::TransportTCP::setKeepAlive(bool, uint32_t, uint32_t, uint32_t)",fmt,
                 (ulong)uVar1,(this->cached_remote_host_)._M_dataplus._M_p);
  return;
}

Assistant:

void TransportTCP::setKeepAlive(bool use, uint32_t idle, uint32_t interval, uint32_t count)
{
  if (use)
  {
    int val = 1;
    if (setsockopt(sock_, SOL_SOCKET, SO_KEEPALIVE, reinterpret_cast<const char*>(&val), sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set SO_KEEPALIVE on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }

/* cygwin SOL_TCP does not seem to support TCP_KEEPIDLE, TCP_KEEPINTVL, TCP_KEEPCNT */
#if defined(SOL_TCP) && defined(TCP_KEEPIDLE)
    val = idle;
    if (setsockopt(sock_, SOL_TCP, TCP_KEEPIDLE, &val, sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set TCP_KEEPIDLE on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }
#else
    (void)idle;
#endif

#if defined(SOL_TCP) && defined(TCP_KEEPINTVL)
    val = interval;
    if (setsockopt(sock_, SOL_TCP, TCP_KEEPINTVL, &val, sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set TCP_KEEPINTVL on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }
#else
    (void)interval;
#endif

#if defined(SOL_TCP) && defined(TCP_KEEPCNT)
    val = count;
    if (setsockopt(sock_, SOL_TCP, TCP_KEEPCNT, &val, sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set TCP_KEEPCNT on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }
#else
    (void)count;
#endif
  }
  else
  {
    int val = 0;
    if (setsockopt(sock_, SOL_SOCKET, SO_KEEPALIVE, reinterpret_cast<const char*>(&val), sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set SO_KEEPALIVE on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }
  }
}